

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O0

int TPZFMatrix<double>::Substitution(double *ptr,int64_t rows,TPZFMatrix<double> *B)

{
  bool bVar1;
  int64_t iVar2;
  int64_t iVar3;
  TPZBaseMatrix *in_RDX;
  long in_RSI;
  long in_RDI;
  double tmp;
  int64_t col_1;
  int64_t col;
  int64_t j;
  int64_t i;
  int64_t colb;
  int64_t rowb;
  char *in_stack_00000168;
  char *in_stack_00000170;
  ulong local_48;
  ulong local_40;
  long local_38;
  long local_30;
  
  iVar2 = TPZBaseMatrix::Rows(in_RDX);
  iVar3 = TPZBaseMatrix::Cols(in_RDX);
  if (iVar2 != in_RSI) {
    Error(in_stack_00000170,in_stack_00000168);
  }
  for (local_30 = 0; local_30 < iVar2; local_30 = local_30 + 1) {
    for (local_40 = 0; (long)local_40 < iVar3; local_40 = local_40 + 1) {
      for (local_38 = 0; local_38 < local_30; local_38 = local_38 + 1) {
        in_RDX[1].super_TPZSavable._vptr_TPZSavable[(local_40 & 0xffffffff) * iVar2 + local_30] =
             (_func_int *)
             (-*(double *)(in_RDI + (local_38 * in_RSI + local_30) * 8) *
              (double)in_RDX[1].super_TPZSavable._vptr_TPZSavable
                      [(local_40 & 0xffffffff) * iVar2 + local_38] +
             (double)in_RDX[1].super_TPZSavable._vptr_TPZSavable
                     [(local_40 & 0xffffffff) * iVar2 + local_30]);
      }
    }
  }
  for (local_48 = 0; local_38 = iVar2, (long)local_48 < iVar3; local_48 = local_48 + 1) {
    while (local_30 = local_38 + -1, -1 < local_30) {
      for (; local_38 < iVar2; local_38 = local_38 + 1) {
        in_RDX[1].super_TPZSavable._vptr_TPZSavable[(local_48 & 0xffffffff) * iVar2 + local_30] =
             (_func_int *)
             (-*(double *)(in_RDI + (local_38 * in_RSI + local_30) * 8) *
              (double)in_RDX[1].super_TPZSavable._vptr_TPZSavable
                      [(local_48 & 0xffffffff) * iVar2 + local_38] +
             (double)in_RDX[1].super_TPZSavable._vptr_TPZSavable
                     [(local_48 & 0xffffffff) * iVar2 + local_30]);
      }
      bVar1 = IsZero(*(double *)(in_RDI + (local_30 * in_RSI + local_30) * 8));
      if (bVar1) {
        if (ABS(*(double *)(in_RDI + (local_30 * in_RSI + local_30) * 8)) <= 0.0) {
          Error(in_stack_00000170,in_stack_00000168);
        }
        else if (1e-12 < ABS((double)in_RDX[1].super_TPZSavable._vptr_TPZSavable
                                     [(local_48 & 0xffffffff) * iVar2 + local_30] -
                             *(double *)(in_RDI + (local_30 * in_RSI + local_30) * 8))) {
          Error(in_stack_00000170,in_stack_00000168);
        }
      }
      in_RDX[1].super_TPZSavable._vptr_TPZSavable[(local_48 & 0xffffffff) * iVar2 + local_30] =
           (_func_int *)
           ((double)in_RDX[1].super_TPZSavable._vptr_TPZSavable
                    [(local_48 & 0xffffffff) * iVar2 + local_30] /
           *(double *)(in_RDI + (local_30 * in_RSI + local_30) * 8));
      local_38 = local_30;
    }
  }
  return 1;
}

Assistant:

int TPZFMatrix<TVar>::Substitution(const TVar *ptr, int64_t rows, TPZFMatrix<TVar> *B)
{
    int64_t rowb = B->Rows();
    int64_t colb = B->Cols();
    if ( rowb != rows ) Error( "static::SubstitutionLU <incompatible dimensions>" );
    int64_t i,j;
    for ( i = 0; i < rowb; i++ ) {
        for ( int64_t col = 0; col < colb; col++ )
            for (j = 0; j < i; j++ )
                //B->PutVal( i, col, B->GetVal(i, col) - GetVal(i, j) * B->GetVal(j, col) );
                PUTVAL(B, rowb, i, col, GETVAL(B, rowb, i, col) - SELECTEL(ptr, rows, i, j) * GETVAL(B, rowb, j, col));
    }
    
    for (int64_t col=0; col<colb; col++){
        for ( i = rowb-1; i >= 0; i-- ) {
            for (j = i+1; j < rowb ; j++ )
                //B->PutVal( i, col, B->GetVal(i, col) - GetVal(i, j) * B->GetVal(j, col) );
                PUTVAL(B, rowb, i, col, GETVAL(B, rowb, i, col) - SELECTEL(ptr, rows, i, j) * GETVAL(B, rowb, j, col));
            if ( IsZero( SELECTEL(ptr, rows, i, i)/*GetVal(i, i)*/ ) ) {
                if (fabs(SELECTEL(ptr, rows, i, i)/*GetVal(i, i)*/) > fabs((TVar)0.)) {
                    TVar tmp = GETVAL(B, rowb, i, col) - SELECTEL(ptr, rows, i, i);/*B->GetVal(i, col) - GetVal(i, i)*/
                    if (fabs(tmp) > fabs(((TVar)1e-12))) {
                        Error( "static::BackSub(SubstitutionLU) <Matrix is singular even after Power Plus..." );
                    }
                }else  Error( "static::BackSub(SubstitutionLU) <Matrix is singular" );
            }
            PUTVAL(B, rowb, i, col, GETVAL(B, rowb, i, col)/SELECTEL(ptr, rows, i, i));
            //B->PutVal( i, col, B->GetVal( i, col) / GetVal(i, i) );
        }
    }
    return( 1 );
}